

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  xpath_allocator *in_R9;
  char *__s1;
  xpath_node local_38;
  
  __s1 = "";
  if (parent->name != (char_t *)0x0) {
    __s1 = parent->name;
  }
  bVar3 = false;
  switch((uint)this & 0xff) {
  case 1:
    iVar4 = strcmp(__s1,(char *)ns);
    if (iVar4 != 0) {
      return false;
    }
    cVar6 = 'x';
    lVar5 = 0;
    do {
      if (__s1[lVar5] != cVar6) goto LAB_0013200e;
      cVar6 = "xmlns"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    break;
  case 2:
  case 7:
    cVar6 = 'x';
    lVar5 = 0;
    do {
      if (__s1[lVar5] != cVar6) goto LAB_0013200e;
      cVar6 = "xmlns"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    break;
  default:
    goto switchD_00131f6a_caseD_3;
  case 8:
    uVar2 = (undefined1)ns->_type;
    if (uVar2 != type_unsorted) {
      lVar5 = 0;
      do {
        if (__s1[lVar5] != uVar2) {
          return false;
        }
        uVar2 = *(char *)((long)&ns->_type + lVar5 + 1);
        lVar5 = lVar5 + 1;
      } while (uVar2 != type_unsorted);
    }
    cVar6 = 'x';
    lVar5 = 0;
    do {
      if (__s1[lVar5] != cVar6) goto LAB_0013200e;
      cVar6 = "xmlns"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
  }
  bVar3 = false;
  if ((__s1[5] != '\0') && (bVar3 = false, __s1[5] != ':')) {
LAB_0013200e:
    if (parent == (xml_node_struct *)0x0) {
      alloc = (xpath_allocator *)0x0;
    }
    pxVar1 = (xml_attribute_struct *)a->value;
    if (pxVar1 == a->prev_attribute_c) {
      local_38._node._root = (xml_node_struct *)alloc;
      local_38._attribute._attr = (xml_attribute_struct *)parent;
      xpath_node_set_raw::push_back_grow((xpath_node_set_raw *)a,&local_38,in_R9);
    }
    else {
      a->value = (char_t *)&pxVar1->value;
      pxVar1->header = (uintptr_t)alloc;
      pxVar1->name = (char_t *)parent;
    }
    bVar3 = true;
  }
switchD_00131f6a_caseD_3:
  return bVar3;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}